

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPetNet.cpp
# Opt level: O3

bool __thiscall NaPetriNet::ask_for_node(NaPetriNet *this,NaPetriNode *pNode,int *pIndex)

{
  int iVar1;
  undefined4 extraout_var;
  uint uVar2;
  
  uVar2 = 0;
  if (0 < (this->pnaNet).nItems) {
    do {
      iVar1 = (*(this->pnaNet)._vptr_NaDynAr[0xf])(&this->pnaNet,(ulong)uVar2);
      if (*(NaPetriNode **)CONCAT44(extraout_var,iVar1) == pNode) {
        if (pIndex == (int *)0x0) {
          return true;
        }
        *pIndex = uVar2;
        return true;
      }
      uVar2 = uVar2 + 1;
    } while ((int)uVar2 < (this->pnaNet).nItems);
  }
  return false;
}

Assistant:

bool
NaPetriNet::ask_for_node (NaPetriNode* pNode, int *pIndex)
{
    int i;
    for(i = 0; i < pnaNet.count(); ++i){
        if(pNode == pnaNet[i]){
            if(NULL != pIndex){
                *pIndex = i;
            }
            return true;
        }
    }
    return false;
}